

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall
ON_Viewport::SetCamera(ON_Viewport *this,ON_Viewport *source_viewport,bool bBreakLocks)

{
  undefined3 in_register_00000011;
  ON_3dVector local_38;
  
  if (CONCAT31(in_register_00000011,bBreakLocks) != 0) {
    this->m_bLockCamUp = false;
    this->m_bLockCamDir = false;
    this->m_bLockCamLoc = false;
  }
  local_38.z = (source_viewport->m_CamDir).z;
  local_38.x = (source_viewport->m_CamDir).x;
  local_38.y = (source_viewport->m_CamDir).y;
  SetCameraDirection(this,&local_38);
  local_38.z = (source_viewport->m_CamUp).z;
  local_38.x = (source_viewport->m_CamUp).x;
  local_38.y = (source_viewport->m_CamUp).y;
  SetCameraUp(this,&local_38);
  local_38.z = (source_viewport->m_CamLoc).z;
  local_38.x = (source_viewport->m_CamLoc).x;
  local_38.y = (source_viewport->m_CamLoc).y;
  SetCameraLocation(this,(ON_3dPoint *)&local_38);
  return this->m_bValidCamera;
}

Assistant:

bool ON_Viewport::SetCamera(
  const ON_Viewport& source_viewport,
  bool bBreakLocks
)
{
  if (bBreakLocks)
  {
    SetCameraDirectionLock(false);
    SetCameraUpLock(false);
    SetCameraLocationLock(false);
  }

  SetCameraDirection(source_viewport.CameraDirection());
  SetCameraUp(source_viewport.CameraUp());
  SetCameraLocation(source_viewport.CameraLocation());

  return m_bValidCamera;
}